

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O0

void ddb_ex(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  Integer *ardims_00;
  Integer *pedims_00;
  void *__ptr;
  long *__ptr_00;
  Integer *in_RCX;
  long in_RDX;
  Integer *in_RSI;
  size_t in_RDI;
  Integer *in_R8;
  bool bVar1;
  double in_XMM0_Qa;
  double dVar2;
  double blb;
  double clb;
  long cev;
  long r;
  Integer *tard;
  long *stack;
  long done;
  long pc;
  long bev;
  long k;
  long j;
  long i;
  long npdivs;
  long *pdivs;
  Integer *tdims;
  double local_a8;
  long local_98;
  long local_90;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  size_t local_48;
  
  if (in_RDI == 1) {
    *in_R8 = in_RDX;
    dd_ev(1,in_RSI,in_R8);
    dd_su(1,in_RSI,in_R8,in_RCX);
  }
  else {
    ardims_00 = (Integer *)calloc(in_RDI,8);
    if (ardims_00 == (Integer *)0x0) {
      fprintf(_stderr,"ddb_ex: Memory allocation failed\n");
      for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
        in_RCX[local_50] = 0;
      }
    }
    else {
      for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
        if (in_RCX[local_50] < 1) {
          in_RCX[local_50] = 1;
        }
      }
      for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
        ardims_00[local_50] = in_RSI[local_50] / in_RCX[local_50];
      }
      for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
        if (ardims_00[local_50] < 1) {
          ardims_00[local_50] = 1;
          in_RCX[local_50] = in_RSI[local_50];
        }
      }
      pedims_00 = (Integer *)calloc(in_RDI,8);
      if (pedims_00 == (Integer *)0x0) {
        fprintf(_stderr,"ddb_ex: Memory allocation failed\n");
        for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
          in_RCX[local_50] = 0;
        }
      }
      else {
        local_48 = 1;
        for (local_50 = 2; local_50 <= in_RDX; local_50 = local_50 + 1) {
          if (in_RDX % local_50 == 0) {
            local_48 = local_48 + 1;
          }
        }
        __ptr = calloc(local_48,8);
        if (__ptr == (void *)0x0) {
          fprintf(_stderr,"ddb_ex: Memory allocation failed\n");
          for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
            in_RCX[local_50] = 0;
          }
          free(ardims_00);
        }
        else {
          __ptr_00 = (long *)calloc(in_RDI,8);
          if (__ptr_00 == (long *)0x0) {
            fprintf(_stderr,"%s: %s\n","ddb_ex","memory allocation failed");
            for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
              in_RCX[local_50] = 0;
            }
            free(ardims_00);
            free(__ptr);
          }
          else {
            local_58 = 0;
            for (local_50 = 1; local_50 <= in_RDX; local_50 = local_50 + 1) {
              if (in_RDX % local_50 == 0) {
                *(long *)((long)__ptr + local_58 * 8) = local_50;
                local_58 = local_58 + 1;
              }
            }
            local_a8 = -1.0;
            local_68 = 1;
            for (local_50 = 0; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
              local_68 = ardims_00[local_50] * local_68;
            }
            *in_R8 = in_RDX;
            for (local_50 = 1; local_50 < (long)in_RDI; local_50 = local_50 + 1) {
              in_R8[local_50] = 1;
            }
            *pedims_00 = 0;
            *__ptr_00 = in_RDX;
            local_70 = 0;
            bVar1 = false;
            do {
              if (local_70 == in_RDI - 1) {
                pedims_00[local_70] = __ptr_00[local_70];
                dVar2 = dd_ev(in_RDI,ardims_00,pedims_00);
                local_98 = 0;
                for (local_60 = 0; local_60 < (long)in_RDI; local_60 = local_60 + 1) {
                  local_90 = 1;
                  for (local_58 = 0; local_58 < (long)in_RDI; local_58 = local_58 + 1) {
                    if (local_58 != local_60) {
                      local_90 = local_90 * (ardims_00[local_58] / pedims_00[local_58]);
                    }
                  }
                  local_98 = local_98 + local_90;
                }
                if (local_a8 < dVar2) {
LAB_0025f6cd:
                  for (local_58 = 0; local_58 < (long)in_RDI; local_58 = local_58 + 1) {
                    in_R8[local_58] = pedims_00[local_58];
                  }
                  local_68 = local_98;
                  local_a8 = dVar2;
                }
                else if (((dVar2 == local_a8) && (!NAN(dVar2) && !NAN(local_a8))) &&
                        (local_98 < local_68)) goto LAB_0025f6cd;
                if (in_XMM0_Qa < local_a8) break;
                pedims_00[local_70] = 0;
                local_70 = local_70 + -1;
              }
              else if (pedims_00[local_70] == __ptr_00[local_70]) {
                bVar1 = local_70 == 0;
                pedims_00[local_70] = 0;
                local_70 = local_70 + -1;
              }
              else {
                pedims_00[local_70] = pedims_00[local_70] + 1;
                while (__ptr_00[local_70] % pedims_00[local_70] != 0) {
                  pedims_00[local_70] = pedims_00[local_70] + 1;
                }
                local_70 = local_70 + 1;
                __ptr_00[local_70] = in_RDX;
                for (local_50 = 0; local_50 < local_70; local_50 = local_50 + 1) {
                  __ptr_00[local_70] = __ptr_00[local_70] / pedims_00[local_50];
                }
                pedims_00[local_70] = 0;
              }
            } while (!bVar1);
            dd_su(in_RDI,in_RSI,in_R8,in_RCX);
            free(ardims_00);
            free(__ptr_00);
            free(pedims_00);
            free(__ptr);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ddb_ex( long ndims, Integer ardims[], long npes, double threshold,
             Integer blk[], Integer pedims[])
{
      Integer *tdims;
      long *pdivs;
      long npdivs;
      long i, j, k;
      long bev;
      long pc, done;
      long *stack;
      Integer *tard;
      long r, cev;
      double clb, blb;

      /*- Quick exit -*/
      if(ndims==1) {
           pedims[0] = npes;
           blb = dd_ev(ndims,ardims,pedims);
           dd_su(1,ardims,pedims,blk);
           return;
      }

      /*- Reset array dimensions to reflect granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i]; }

      /*- Allocate memory for current solution -*/
      tdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tdims==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }

      /*- Allocate memory to hold divisors of npes -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      /*- Allocate storage for the recursion stack -*/
      stack = (long *) calloc((size_t)ndims,sizeof(long));
      if(stack==NULL){
         fprintf(stderr,"%s: %s\n","ddb_ex",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(pdivs);
         return;
      }

      /*- Find all divisors of npes -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;

      /*- Pump priming the exhaustive search -*/
      blb = -1.0;
      bev = 1.0;
      for(i=0;i<ndims;i++) bev *= tard[i];
      pedims[0]=npes; for(i=1;i<ndims;i++) pedims[i] = 1;
      tdims[0] = 0;
      stack[0] = npes;
      pc = 0;
      done = 0;

      /*-  Recursion loop -*/
      do {
         if(pc==ndims-1) {
	   /*- Set the number of processes for the last dimension -*/
           tdims[pc] = stack[pc];

	   /*- Evaluate current solution  -*/
            clb = dd_ev(ndims,tard,tdims);
            cev = 0;
            for(k=0; k<ndims; k++){
               r = 1;
               for(j=0; j<ndims; j++) {
                  if(j!=k) r = r*(tard[j]/tdims[j]);
               }
               cev = cev+r;
            }
            if(clb>blb || (clb==blb && cev<bev)) {
               for(j=0; j<ndims; j++) pedims[j] = tdims[j];
               blb = clb;
               bev = cev;
            }
            if(blb>threshold) break;
            tdims[pc] = 0;
            pc -= 1;
         } else {
           if( tdims[pc] == stack[pc] ) {
	     /*- Backtrack when current array dimension has exhausted 
              *- all remaining processes
              */
              done = (pc==0);
              tdims[pc] = 0;
              pc -= 1;
           } else {
	     /*- Increment the number of processes assigned to the current
              *- array axis.
              */
              for(tdims[pc]+=1; stack[pc]%tdims[pc]!=0; tdims[pc]+=1);
              pc += 1;
              stack[pc] = npes;
              for(i=0;i<pc;i++) stack[pc] /= tdims[i];
              tdims[pc] = 0;
           }
         }
      } while(!done);

      dd_su(ndims,ardims,pedims,blk);

      free(tard);
      free(stack);
      free(tdims);
      free(pdivs);
}